

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::allocateWorkAndBaseArrays(HEkk *this)

{
  size_type __new_size;
  
  __new_size = (long)(this->lp_).num_row_ + (long)(this->lp_).num_col_;
  std::vector<double,_std::allocator<double>_>::resize(&(this->info_).workCost_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->info_).workDual_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->info_).workShift_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->info_).workLower_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->info_).workUpper_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->info_).workRange_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->info_).workValue_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->info_).workLowerShift_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&(this->info_).workUpperShift_,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&(this->info_).devex_index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->info_).baseLower_,(long)(this->lp_).num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->info_).baseUpper_,(long)(this->lp_).num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->info_).baseValue_,(long)(this->lp_).num_row_);
  return;
}

Assistant:

void HEkk::allocateWorkAndBaseArrays() {
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  info_.workCost_.resize(num_tot);
  info_.workDual_.resize(num_tot);
  info_.workShift_.resize(num_tot);

  info_.workLower_.resize(num_tot);
  info_.workUpper_.resize(num_tot);
  info_.workRange_.resize(num_tot);
  info_.workValue_.resize(num_tot);
  info_.workLowerShift_.resize(num_tot);
  info_.workUpperShift_.resize(num_tot);

  // Feel that it should be possible to resize this with in dual
  // solver, and only if Devex is being used, but a pointer to it
  // needs to be set up when constructing HDual
  info_.devex_index_.resize(num_tot);

  info_.baseLower_.resize(lp_.num_row_);
  info_.baseUpper_.resize(lp_.num_row_);
  info_.baseValue_.resize(lp_.num_row_);
}